

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O0

void duckdb::udf_ternary_function<duckdb::date_t>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  PhysicalType PVar1;
  bool bVar2;
  string_t *psVar3;
  string_t *psVar4;
  TemplatedValidityMask<unsigned_long> *pTVar5;
  idx_t iVar6;
  char *__src;
  date_t *pdVar7;
  date_t *pdVar8;
  Vector *in_RDX;
  DataChunk *in_RDI;
  anon_union_16_2_67f50693_for_value aVar9;
  idx_t i_1;
  ValidityMask *mask;
  date_t *ldata_1;
  date_t *result_data_1;
  char *target_data;
  string_t target;
  idx_t input_length;
  idx_t i;
  ValidityMask *validity;
  string_t *ldata;
  string_t *result_data;
  ValidityMask *in_stack_ffffffffffffff68;
  ulong uVar10;
  Vector *in_stack_ffffffffffffff70;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff78;
  TemplatedValidityMask<unsigned_long> *this;
  Vector *this_00;
  ulong local_78;
  TemplatedValidityMask<unsigned_long> *local_38;
  
  duckdb::DataChunk::Flatten();
  PVar1 = GetTypeId<duckdb::date_t>();
  if (PVar1 == VARCHAR) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    psVar3 = FlatVector::GetData<duckdb::string_t>((Vector *)0x4cad97);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff70,
               (size_type)in_stack_ffffffffffffff68);
    psVar4 = FlatVector::GetData<duckdb::string_t>((Vector *)0x4cadb6);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff70,
               (size_type)in_stack_ffffffffffffff68);
    FlatVector::Validity((Vector *)0x4cadd4);
    this_00 = in_RDX;
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff70,
               (size_type)in_stack_ffffffffffffff68);
    FlatVector::Validity((Vector *)0x4cae00);
    FlatVector::SetValidity(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_38 = (TemplatedValidityMask<unsigned_long> *)0x0;
    while (this = local_38, pTVar5 = (TemplatedValidityMask<unsigned_long> *)DataChunk::size(in_RDI)
          , this < pTVar5) {
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (this,(idx_t)in_stack_ffffffffffffff70);
      if (bVar2) {
        iVar6 = string_t::GetSize(psVar4 + (long)local_38);
        aVar9 = (anon_union_16_2_67f50693_for_value)duckdb::StringVector::EmptyString(in_RDX,iVar6);
        in_stack_ffffffffffffff70 =
             (Vector *)string_t::GetDataWriteable((string_t *)in_stack_ffffffffffffff70);
        __src = string_t::GetData((string_t *)in_stack_ffffffffffffff70);
        memcpy(in_stack_ffffffffffffff70,__src,iVar6);
        string_t::Finalize((string_t *)this_00);
        psVar3[(long)local_38].value = aVar9;
      }
      local_38 = (TemplatedValidityMask<unsigned_long> *)((long)&local_38->validity_mask + 1);
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    pdVar7 = FlatVector::GetData<duckdb::date_t>((Vector *)0x4caf2e);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff70,
               (size_type)in_stack_ffffffffffffff68);
    pdVar8 = FlatVector::GetData<duckdb::date_t>((Vector *)0x4caf4d);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff70,
               (size_type)in_stack_ffffffffffffff68);
    FlatVector::Validity((Vector *)0x4caf6c);
    FlatVector::SetValidity(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_78 = 0;
    while (uVar10 = local_78, iVar6 = DataChunk::size(in_RDI), uVar10 < iVar6) {
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff78,(idx_t)in_stack_ffffffffffffff70);
      if (bVar2) {
        pdVar7[local_78].days = pdVar8[local_78].days;
      }
      local_78 = local_78 + 1;
    }
  }
  return;
}

Assistant:

static void udf_ternary_function(DataChunk &input, ExpressionState &state, Vector &result) {
	input.Flatten();
	switch (GetTypeId<TYPE>()) {
	case PhysicalType::VARCHAR: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<string_t>(result);
		auto ldata = FlatVector::GetData<string_t>(input.data[2]);
		auto &validity = FlatVector::Validity(input.data[0]);

		FlatVector::SetValidity(result, FlatVector::Validity(input.data[2]));

		for (idx_t i = 0; i < input.size(); i++) {
			if (!validity.RowIsValid(i)) {
				continue;
			}
			auto input_length = ldata[i].GetSize();
			string_t target = StringVector::EmptyString(result, input_length);
			auto target_data = target.GetDataWriteable();
			memcpy(target_data, ldata[i].GetData(), input_length);
			target.Finalize();
			result_data[i] = target;
		}
		break;
	}
	default: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<TYPE>(result);
		auto ldata = FlatVector::GetData<TYPE>(input.data[2]);
		auto &mask = FlatVector::Validity(input.data[2]);
		FlatVector::SetValidity(result, mask);

		for (idx_t i = 0; i < input.size(); i++) {
			if (!mask.RowIsValid(i)) {
				continue;
			}
			result_data[i] = ldata[i];
		}
	}
	}
}